

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::App(App *this,string *description_,string *name,App *parent)

{
  Formatter *this_00;
  ConfigINI *this_01;
  string *psVar1;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  allocator<char> local_35 [13];
  App *local_28;
  App *parent_local;
  string *name_local;
  string *description__local;
  App *this_local;
  
  this->_vptr_App = (_func_int **)&PTR__App_001aee28;
  local_28 = parent;
  parent_local = (App *)name;
  name_local = description_;
  description__local = (string *)this;
  ::std::__cxx11::string::string((string *)&this->name_,(string *)name);
  ::std::__cxx11::string::string((string *)&this->description_,(string *)description_);
  this->allow_extras_ = false;
  this->allow_config_extras_ = false;
  this->prefix_command_ = false;
  std::function<void_()>::function(&this->callback_);
  OptionDefaults::OptionDefaults(&this->option_defaults_);
  std::
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ::vector(&this->options_);
  ::std::__cxx11::string::string((string *)&this->footer_);
  this->help_ptr_ = (Option *)0x0;
  this->help_all_ptr_ = (Option *)0x0;
  this_00 = (Formatter *)operator_new(0x40);
  (this_00->super_FormatterBase).labels_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  (this_00->super_FormatterBase).labels_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this_00->super_FormatterBase).labels_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this_00->super_FormatterBase).labels_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  *(undefined8 *)&(this_00->super_FormatterBase).labels_._M_t._M_impl = 0;
  *(undefined8 *)
   &(this_00->super_FormatterBase).labels_._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this_00->super_FormatterBase)._vptr_FormatterBase = (_func_int **)0x0;
  (this_00->super_FormatterBase).column_width_ = 0;
  Formatter::Formatter(this_00);
  ::std::shared_ptr<CLI::FormatterBase>::shared_ptr<CLI::Formatter,void>(&this->formatter_,this_00);
  ::std::function<std::__cxx11::string(CLI::App_const*,CLI::Error_const&)>::
  function<std::__cxx11::string(&)(CLI::App_const*,CLI::Error_const&),void>
            ((function<std::__cxx11::string(CLI::App_const*,CLI::Error_const&)> *)
             &this->failure_message_,FailureMessage::simple_abi_cxx11_);
  std::
  vector<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->missing_);
  std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::vector(&this->parse_order_);
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&this->parsed_subcommands_);
  std::
  vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  ::vector(&this->subcommands_);
  this->ignore_case_ = false;
  this->fallthrough_ = false;
  this->parent_ = local_28;
  this->parsed_ = false;
  this->require_subcommand_min_ = 0;
  this->require_subcommand_max_ = 0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->group_,"Subcommands",local_35);
  ::std::allocator<char>::~allocator((allocator<char> *)local_35);
  ::std::__cxx11::string::string((string *)&this->config_name_);
  this->config_required_ = false;
  this->config_ptr_ = (Option *)0x0;
  this_01 = (ConfigINI *)operator_new(0x20);
  (this_01->super_Config).items.
  super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->super_Config).items.
  super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_01->super_Config)._vptr_Config = (_func_int **)0x0;
  (this_01->super_Config).items.
  super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ConfigINI::ConfigINI(this_01);
  ::std::shared_ptr<CLI::Config>::shared_ptr<CLI::ConfigINI,void>(&this->config_formatter_,this_01);
  if (this->parent_ != (App *)0x0) {
    if (this->parent_->help_ptr_ != (Option *)0x0) {
      Option::get_name_abi_cxx11_(&local_58,this->parent_->help_ptr_,false,true);
      psVar1 = Option::get_description_abi_cxx11_(this->parent_->help_ptr_);
      ::std::__cxx11::string::string((string *)&local_78,(string *)psVar1);
      set_help_flag(this,&local_58,&local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
      ::std::__cxx11::string::~string((string *)&local_58);
    }
    if (this->parent_->help_all_ptr_ != (Option *)0x0) {
      Option::get_name_abi_cxx11_(&local_98,this->parent_->help_all_ptr_,false,true);
      psVar1 = Option::get_description_abi_cxx11_(this->parent_->help_all_ptr_);
      ::std::__cxx11::string::string((string *)&local_b8,(string *)psVar1);
      set_help_all_flag(this,&local_98,&local_b8);
      ::std::__cxx11::string::~string((string *)&local_b8);
      ::std::__cxx11::string::~string((string *)&local_98);
    }
    OptionDefaults::operator=(&this->option_defaults_,&this->parent_->option_defaults_);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
    ::operator=(&this->failure_message_,&this->parent_->failure_message_);
    this->allow_extras_ = (bool)(this->parent_->allow_extras_ & 1);
    this->allow_config_extras_ = (bool)(this->parent_->allow_config_extras_ & 1);
    this->prefix_command_ = (bool)(this->parent_->prefix_command_ & 1);
    this->ignore_case_ = (bool)(this->parent_->ignore_case_ & 1);
    this->fallthrough_ = (bool)(this->parent_->fallthrough_ & 1);
    ::std::__cxx11::string::operator=((string *)&this->group_,(string *)&this->parent_->group_);
    ::std::__cxx11::string::operator=((string *)&this->footer_,(string *)&this->parent_->footer_);
    std::shared_ptr<CLI::FormatterBase>::operator=(&this->formatter_,&this->parent_->formatter_);
    std::shared_ptr<CLI::Config>::operator=
              (&this->config_formatter_,&this->parent_->config_formatter_);
    this->require_subcommand_max_ = this->parent_->require_subcommand_max_;
  }
  return;
}

Assistant:

App(std::string description_, std::string name, App *parent)
        : name_(std::move(name)), description_(std::move(description_)), parent_(parent) {
        // Inherit if not from a nullptr
        if(parent_ != nullptr) {
            if(parent_->help_ptr_ != nullptr)
                set_help_flag(parent_->help_ptr_->get_name(false, true), parent_->help_ptr_->get_description());
            if(parent_->help_all_ptr_ != nullptr)
                set_help_all_flag(parent_->help_all_ptr_->get_name(false, true),
                                  parent_->help_all_ptr_->get_description());

            /// OptionDefaults
            option_defaults_ = parent_->option_defaults_;

            // INHERITABLE
            failure_message_ = parent_->failure_message_;
            allow_extras_ = parent_->allow_extras_;
            allow_config_extras_ = parent_->allow_config_extras_;
            prefix_command_ = parent_->prefix_command_;
            ignore_case_ = parent_->ignore_case_;
            fallthrough_ = parent_->fallthrough_;
            group_ = parent_->group_;
            footer_ = parent_->footer_;
            formatter_ = parent_->formatter_;
            config_formatter_ = parent_->config_formatter_;
            require_subcommand_max_ = parent_->require_subcommand_max_;
        }
    }